

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeMemAddTerminator(Mem *pMem)

{
  int iVar1;
  long in_RDI;
  Mem *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  iVar1 = sqlite3VdbeMemGrow(in_stack_ffffffffffffffe8,0,0x173413);
  if (iVar1 == 0) {
    *(undefined1 *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RDI + 0x10)) = 0;
    *(undefined1 *)(*(long *)(in_RDI + 8) + (long)(*(int *)(in_RDI + 0x10) + 1)) = 0;
    *(undefined1 *)(*(long *)(in_RDI + 8) + (long)(*(int *)(in_RDI + 0x10) + 2)) = 0;
    *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) | 0x200;
    local_4 = 0;
  }
  else {
    local_4 = 7;
  }
  return local_4;
}

Assistant:

static SQLITE_NOINLINE int vdbeMemAddTerminator(Mem *pMem){
  if( sqlite3VdbeMemGrow(pMem, pMem->n+3, 1) ){
    return SQLITE_NOMEM_BKPT;
  }
  pMem->z[pMem->n] = 0;
  pMem->z[pMem->n+1] = 0;
  pMem->z[pMem->n+2] = 0;
  pMem->flags |= MEM_Term;
  return SQLITE_OK;
}